

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O0

int lejp_parser_push(lejp_ctx *ctx,void *user,char **paths,uchar paths_count,lejp_callback lejp_cb)

{
  _lejp_parsing_stack *p_Var1;
  _lejp_parsing_stack *p;
  lejp_callback lejp_cb_local;
  uchar paths_count_local;
  char **paths_local;
  void *user_local;
  lejp_ctx *ctx_local;
  
  if (ctx->pst_sp == '\x04') {
    ctx_local._4_4_ = -1;
  }
  else {
    lejp_check_path_match(ctx);
    ctx->pst[ctx->pst_sp].path_match = ctx->path_match;
    ctx->pst_sp = ctx->pst_sp + '\x01';
    p_Var1 = ctx->pst + ctx->pst_sp;
    p_Var1->user = user;
    p_Var1->callback = lejp_cb;
    p_Var1->paths = paths;
    p_Var1->count_paths = paths_count;
    p_Var1->ppos = '\0';
    ctx->path_match = '\0';
    lejp_check_path_match(ctx);
    _lws_log(0x10,"%s: pushed parser stack to %d (path %s)\n","lejp_parser_push",(ulong)ctx->pst_sp,
             ctx->path);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int
lejp_parser_push(struct lejp_ctx *ctx, void *user, const char * const *paths,
		 unsigned char paths_count, lejp_callback lejp_cb)
{
	struct _lejp_parsing_stack *p;

	if (ctx->pst_sp + 1 == LEJP_MAX_PARSING_STACK_DEPTH)
		return -1;

	lejp_check_path_match(ctx);

	ctx->pst[ctx->pst_sp].path_match = ctx->path_match;
	ctx->pst_sp++;

	p = &ctx->pst[ctx->pst_sp];
	p->user = user;
	p->callback = lejp_cb;
	p->paths = paths;
	p->count_paths = paths_count;
	p->ppos = 0;

	ctx->path_match = 0;
	lejp_check_path_match(ctx);

	lwsl_debug("%s: pushed parser stack to %d (path %s)\n", __func__,
		   ctx->pst_sp, ctx->path);

	return 0;
}